

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void testing::internal::
     SharedPayload<testing::internal::EqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
     ::Destroy(SharedPayloadBase *shared)

{
  if (shared != (SharedPayloadBase *)0x0) {
    std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::
    ~_Vector_base((_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                  (shared + 2));
  }
  operator_delete(shared,0x20);
  return;
}

Assistant:

static void Destroy(SharedPayloadBase* shared) {
    delete static_cast<SharedPayload*>(shared);
  }